

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

void __thiscall
Inline::AdjustArgoutsForCallTargetInlining
          (Inline *this,Instr *callInstr,Instr **pExplicitThisArgOut,bool isCallInstanceFunction)

{
  int iVar1;
  Opnd *this_00;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  uint uVar5;
  undefined4 *puVar6;
  StackSym *pSVar7;
  SymOpnd *pSVar8;
  RegOpnd *pRVar9;
  Instr *pIVar10;
  Instr *pIVar11;
  IntConstOpnd *pIVar12;
  IntConstOpnd *pIVar13;
  Instr *pIVar14;
  Instr *this_01;
  long lVar15;
  Instr *pIVar16;
  Instr *pIVar17;
  undefined4 *local_40;
  
  if (pExplicitThisArgOut == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd73,"(pExplicitThisArgOut)","pExplicitThisArgOut");
    if (!bVar3) goto LAB_0050be91;
    *puVar6 = 0;
  }
  pSVar7 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar10 = (pSVar7->field_5).m_instrDef;
  if ((pIVar10 != (Instr *)0x0 & pSVar7->field_0x18) == 1) {
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_40 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar3) goto LAB_0050be91;
    *local_40 = 0;
    pIVar10 = (pSVar7->field_5).m_instrDef;
  }
  pIVar16 = (Instr *)0x0;
  pIVar11 = (Instr *)0x0;
  this_01 = (Instr *)0x0;
  do {
    if (pIVar10->m_src2 == (Opnd *)0x0) {
      pIVar17 = (Instr *)0x0;
    }
    else {
      bVar3 = IR::Opnd::IsSymOpnd(pIVar10->m_src2);
      if (bVar3) {
        pSVar8 = IR::Opnd::AsSymOpnd(pIVar10->m_src2);
        pSVar7 = Sym::AsStackSym(pSVar8->m_sym);
        bVar3 = StackSym::IsArgSlotSym(pSVar7);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
          if (!bVar3) goto LAB_0050be91;
          *local_40 = 0;
        }
        if (((((pSVar7->field_0x18 & 1) == 0) || ((pSVar7->field_5).m_instrDef == (Instr *)0x0)) &&
            (bVar3 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar3)) &&
           (bVar3 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar3)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1bf,
                             "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                             ,
                             "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                            );
          if (!bVar3) goto LAB_0050be91;
          *local_40 = 0;
        }
        if ((pSVar7->field_0x18 & 1) != 0) {
          pIVar17 = (pSVar7->field_5).m_instrDef;
          goto LAB_0050ba5e;
        }
      }
      pIVar17 = (Instr *)0x0;
    }
LAB_0050ba5e:
    pIVar14 = this_01;
    if (pIVar10->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar10->m_opcode == StartCall) {
        if (pIVar17 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_40 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar3) goto LAB_0050be91;
          *local_40 = 0;
        }
        break;
      }
      IR::Instr::GenerateBytecodeArgOutCapture(pIVar10);
      pSVar8 = IR::Opnd::AsSymOpnd(pIVar10->m_dst);
      pSVar7 = IR::Opnd::GetStackSym(&pSVar8->super_Opnd);
      iVar1 = pSVar7->m_offset;
      AVar4 = StackSym::GetArgSlotNum(pSVar7);
      if (iVar1 != (uint)AVar4 * 8 + -8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_40 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0xd84,"(argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr)",
                           "argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr");
        if (!bVar3) goto LAB_0050be91;
        *local_40 = 0;
      }
      StackSym::DecrementArgSlotNum(pSVar7);
      AVar4 = StackSym::GetArgSlotNum(pSVar7);
      if (AVar4 != 0) {
        Func::SetArgOffset(this->topFunc,pSVar7,pSVar7->m_offset + -8);
      }
      pIVar14 = pIVar16;
      pIVar16 = pIVar10;
      pIVar11 = this_01;
      if ((isCallInstanceFunction) && (AVar4 = StackSym::GetArgSlotNum(pSVar7), AVar4 != 0)) {
        StackSym::DecrementArgSlotNum(pSVar7);
      }
    }
    this_01 = pIVar14;
    pIVar10 = pIVar17;
  } while (pIVar17 != (Instr *)0x0);
  if (!isCallInstanceFunction) {
    pIVar11 = this_01;
  }
  if (pIVar11 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd96,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar3) goto LAB_0050be91;
    *puVar6 = 0;
  }
  bVar3 = IR::Instr::HasByteCodeArgOutCapture(pIVar11);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd97,"(explicitThisArgOut->HasByteCodeArgOutCapture())",
                       "explicitThisArgOut->HasByteCodeArgOutCapture()");
    if (!bVar3) goto LAB_0050be91;
    *puVar6 = 0;
  }
  this_00 = pIVar16->m_src2;
  bVar3 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar3) {
    pRVar9 = IR::Opnd::AsRegOpnd(this_00);
    pSVar7 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
    if (((pSVar7->field_0x18 & 1) == 0) || ((pSVar7->field_5).m_instrDef == (Instr *)0x0))
    goto LAB_0050bc54;
  }
  else {
LAB_0050bc54:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd9b,
                       "(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef())"
                       ,
                       "linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef()"
                      );
    if (!bVar3) goto LAB_0050be91;
    *puVar6 = 0;
  }
  pRVar9 = IR::Opnd::AsRegOpnd(this_00);
  pSVar7 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
  if ((pSVar7->field_0x18 & 1) == 0) {
    pIVar10 = (Instr *)0x0;
  }
  else {
    pIVar10 = (pSVar7->field_5).m_instrDef;
  }
  if (pIVar10->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd9c,
                       "(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                       ,
                       "linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                      );
    if (!bVar3) {
LAB_0050be91:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pRVar9 = IR::Opnd::AsRegOpnd(this_00);
  pSVar7 = IR::Opnd::GetStackSym(&pRVar9->super_Opnd);
  if ((pSVar7->field_0x18 & 1) == 0) {
    pIVar10 = (Instr *)0x0;
  }
  else {
    pIVar10 = (pSVar7->field_5).m_instrDef;
  }
  IR::Instr::ReplaceSrc2(pIVar11,pIVar10->m_dst);
  *pExplicitThisArgOut = pIVar11;
  if (isCallInstanceFunction) {
    pIVar11 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func,callInstr);
    IR::Instr::ReplaceSrc1(callInstr,this_01->m_src1);
    IR::Instr::SetSrc1(pIVar11,this_01->m_src1);
    IR::Instr::InsertBefore(callInstr,pIVar11);
    IR::Instr::Remove(this_01);
    lVar15 = -2;
  }
  else {
    lVar15 = -1;
  }
  pIVar11 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func,callInstr);
  IR::Instr::SetSrc1(pIVar11,pIVar16->m_src1);
  IR::Instr::InsertBefore(callInstr,pIVar11);
  IR::Instr::Remove(pIVar16);
  uVar5 = IR::Instr::GetArgOutCount(pIVar10,false);
  pIVar12 = IR::IntConstOpnd::New((ulong)uVar5,TyUint32,pIVar10->m_func,false);
  IR::Instr::SetSrc2(pIVar10,&pIVar12->super_Opnd);
  pIVar12 = IR::Opnd::AsIntConstOpnd(pIVar10->m_src1);
  pIVar13 = IR::Opnd::AsIntConstOpnd(pIVar10->m_src1);
  IR::IntConstOpnd::SetValue(pIVar12,lVar15 + (pIVar13->super_EncodableOpnd<long>).m_value);
  return;
}

Assistant:

void
Inline::AdjustArgoutsForCallTargetInlining(IR::Instr* callInstr, IR::Instr ** pExplicitThisArgOut, bool isCallInstanceFunction)
{
    Assert(pExplicitThisArgOut);

    IR::Instr * firstArgOut = nullptr;
    IR::Instr * secondArgOut = nullptr;
    IR::Instr * thirdArgOut = nullptr;

    callInstr->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        thirdArgOut = secondArgOut;
        secondArgOut = firstArgOut;
        firstArgOut = argInstr;

        argInstr->GenerateBytecodeArgOutCapture(); // Generate BytecodeArgOutCapture here to capture the implicit "this" argout (which will be removed) as well,
                                                   // so that any bailout in the call sequence restores the argouts stack as the interpreter would expect it to be.

        StackSym * argSym = argInstr->GetDst()->AsSymOpnd()->GetStackSym();
        
        Assert(argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr);
        argSym->DecrementArgSlotNum(); // We will be removing implicit "this" argout
        if (argSym->GetArgSlotNum() != 0)
        {
            this->topFunc->SetArgOffset(argSym, argSym->m_offset - MachPtr);
        }

        if (isCallInstanceFunction && argSym->GetArgSlotNum() != 0)
        {
            argSym->DecrementArgSlotNum(); // We will also be removing the function argout
        }

        return false;
    });

    IR::Instr * implicitThisArgOut = firstArgOut;
    IR::Instr * explicitThisArgOut = isCallInstanceFunction ? thirdArgOut : secondArgOut;

    Assert(explicitThisArgOut);
    Assert(explicitThisArgOut->HasByteCodeArgOutCapture());


    IR::Opnd* linkOpnd = implicitThisArgOut->GetSrc2();
    Assert(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef());
    Assert(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall);

    IR::Instr* startCall = linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef();

    explicitThisArgOut->ReplaceSrc2(startCall->GetDst());
    *pExplicitThisArgOut = explicitThisArgOut;

    if (isCallInstanceFunction)
    {
        IR::Instr * functionArg = secondArgOut;
        IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
        callInstr->ReplaceSrc1(functionArg->GetSrc1());
        bytecodeArgOutUse->SetSrc1(functionArg->GetSrc1());
        callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the function argout live till the call instruction for it to be captured by any bailout in the call sequence.
        functionArg->Remove();
    }

    IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
    bytecodeArgOutUse->SetSrc1(implicitThisArgOut->GetSrc1());
    callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the implicit "this" argout live till the call instruction for it to be captured by any bailout in the call sequence.
    implicitThisArgOut->Remove();

    startCall->SetSrc2(IR::IntConstOpnd::New(startCall->GetArgOutCount(/*getInterpreterArgOutCount*/ false), TyUint32, startCall->m_func));

    uint argsRemoved = isCallInstanceFunction ? 2 : 1;
    startCall->GetSrc1()->AsIntConstOpnd()->SetValue(startCall->GetSrc1()->AsIntConstOpnd()->GetValue() - argsRemoved);
}